

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O2

mt32emu_return_code
mt32emu_identify_rom_file(mt32emu_rom_info *rom_info,char *filename,char *machine_id)

{
  mt32emu_return_code mVar1;
  FileStream *fs;
  FileStream *local_20;
  
  mVar1 = MT32Emu::createFileStream(filename,&local_20);
  if (local_20 != (FileStream *)0x0) {
    mVar1 = MT32Emu::identifyROM(rom_info,(File *)local_20,machine_id);
    (*(local_20->super_AbstractFile).super_File._vptr_File[1])(local_20);
  }
  return mVar1;
}

Assistant:

mt32emu_return_code MT32EMU_C_CALL mt32emu_identify_rom_file(mt32emu_rom_info *rom_info, const char *filename, const char *machine_id) {
	FileStream *fs;
	mt32emu_return_code rc = createFileStream(filename, fs);
	if (fs == NULL) return rc;
	rc = identifyROM(rom_info, fs, machine_id);
	delete fs;
	return rc;
}